

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

bool Assimp::Ogre::OgreBinarySerializer::ImportSkeleton(IOSystem *pIOHandler,MeshXml *mesh)

{
  Skeleton *this;
  bool bVar1;
  MemoryStreamReaderPtr reader;
  OgreBinarySerializer serializer;
  MemoryStreamReader *local_40;
  MemoryStreamReader *local_38;
  OgreBinarySerializer local_30;
  
  if ((mesh == (MeshXml *)0x0) || ((mesh->skeletonRef)._M_string_length == 0)) {
    bVar1 = false;
  }
  else {
    OpenReader((OgreBinarySerializer *)&local_40,pIOHandler,&mesh->skeletonRef);
    bVar1 = local_40 != (MemoryStreamReader *)0x0;
    if (bVar1) {
      this = (Skeleton *)operator_new(0x38);
      Skeleton::Skeleton(this);
      local_30.m_currentLen = AM_Mesh;
      local_30.m_reader = local_40;
      local_30.assetMode = AM_Skeleton;
      ReadSkeleton(&local_30,this);
      mesh->skeleton = this;
    }
    if (local_38 != (MemoryStreamReader *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
    }
  }
  return bVar1;
}

Assistant:

bool OgreBinarySerializer::ImportSkeleton(Assimp::IOSystem *pIOHandler, MeshXml *mesh)
{
    if (!mesh || mesh->skeletonRef.empty())
        return false;

    MemoryStreamReaderPtr reader = OpenReader(pIOHandler, mesh->skeletonRef);
    if (!reader.get())
        return false;

    Skeleton *skeleton = new Skeleton();
    OgreBinarySerializer serializer(reader.get(), OgreBinarySerializer::AM_Skeleton);
    serializer.ReadSkeleton(skeleton);
    mesh->skeleton = skeleton;
    return true;
}